

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void init_compiler(Compiler *compiler,char *source)

{
  VarHashTable ht;
  size_t local_60;
  uint32_t uStack_58;
  undefined4 uStack_54;
  Scanner scanner;
  
  init_scanner(&scanner,source);
  (compiler->scanner).line = scanner.line;
  *(undefined4 *)&(compiler->scanner).field_0x34 = scanner._52_4_;
  (compiler->scanner).previous.length = scanner.previous.length;
  (compiler->scanner).previous.line = scanner.previous.line;
  *(undefined4 *)&(compiler->scanner).previous.field_0x1c = scanner.previous._28_4_;
  (compiler->scanner).previous.type = scanner.previous.type;
  *(undefined4 *)&(compiler->scanner).previous.field_0x4 = scanner.previous._4_4_;
  (compiler->scanner).previous.start = scanner.previous.start;
  (compiler->scanner).start = scanner.start;
  (compiler->scanner).current = scanner.current;
  *(undefined8 *)&compiler->previous = 0x2c;
  (compiler->previous).start = (char *)0x0;
  (compiler->previous).length = 0;
  *(undefined8 *)&(compiler->previous).line = 1;
  scan_token((Token *)&ht,&compiler->scanner);
  (compiler->token).length = local_60;
  (compiler->token).line = uStack_58;
  *(undefined4 *)&(compiler->token).field_0x1c = uStack_54;
  (compiler->token).type = ht.cap;
  *(uint32_t *)&(compiler->token).field_0x4 = ht.size;
  (compiler->token).start = (char *)ht.buckets;
  scan_token((Token *)&ht,&compiler->scanner);
  (compiler->next).length = local_60;
  (compiler->next).line = uStack_58;
  *(undefined4 *)&(compiler->next).field_0x1c = uStack_54;
  (compiler->next).type = ht.cap;
  *(uint32_t *)&(compiler->next).field_0x4 = ht.size;
  (compiler->next).start = (char *)ht.buckets;
  var_ht_init(&ht,0x10);
  compiler->scope[0].cap = ht.cap;
  compiler->scope[0].size = ht.size;
  compiler->scope[0].buckets = ht.buckets;
  compiler->scope_depth = 0;
  compiler->vars_in_scope = 0;
  compiler->print_expr = false;
  return;
}

Assistant:

static void init_compiler(Compiler *compiler, const char *source) {
    Scanner scanner;
    init_scanner(&scanner, source);

    compiler->scanner = scanner;
    Token err = {TOKEN_ERROR, NULL, 0, 1};
    compiler->previous = err;
    compiler->token = scan_token(&compiler->scanner);
    compiler->next = scan_token(&compiler->scanner);

    VarHashTable ht;
    var_ht_init(&ht, 16);
    compiler->scope[0] = ht;

    compiler->scope_depth = 0;
    compiler->vars_in_scope = 0;
    compiler->print_expr = false;
}